

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTex2D
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  int iVar1;
  int iVar2;
  RenderTarget *this_00;
  PixelFormat *pixelFormat;
  TestLog *log;
  int local_ec;
  ConstPixelBufferAccess local_e0;
  ConstPixelBufferAccess local_b8;
  undefined1 local_89;
  TextureFormat TStack_88;
  bool isOk;
  undefined1 local_80 [8];
  UVec4 threshold;
  undefined1 local_60 [8];
  Surface result;
  Surface reference;
  int levelH;
  int levelW;
  int levelNdx;
  int numLevels;
  ReferenceContext *refContext_local;
  GLContext *gles2Context_local;
  TextureSpecCase *this_local;
  
  if ((this->m_flags & 1) == 0) {
    local_ec = 1;
  }
  else {
    iVar1 = deLog2Floor32(this->m_width);
    iVar2 = deLog2Floor32(this->m_height);
    local_ec = de::max<int>(iVar1,iVar2);
    local_ec = local_ec + 1;
  }
  levelH = 0;
  while( true ) {
    if (local_ec <= levelH) {
      return;
    }
    iVar1 = de::max<int>(1,this->m_width >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,this->m_height >> ((byte)levelH & 0x1f));
    tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
    tcu::Surface::Surface((Surface *)local_60);
    if ((iVar1 < 3) || (iVar2 < 3)) {
      threshold.m_data[2] = 4;
    }
    else {
      sglr::ContextWrapper::setContext(&this->super_ContextWrapper,&gles2Context->super_Context);
      renderTex2D(this,(Surface *)local_60,iVar1,iVar2);
      sglr::ContextWrapper::setContext(&this->super_ContextWrapper,&refContext->super_Context);
      renderTex2D(this,(Surface *)&result.m_pixels.m_cap,iVar1,iVar2);
      this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
      pixelFormat = tcu::RenderTarget::getPixelFormat(this_00);
      TStack_88 = this->m_texFormat;
      computeCompareThreshold((Functional *)local_80,pixelFormat,TStack_88);
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_b8,(Surface *)&result.m_pixels.m_cap);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_e0,(Surface *)local_60);
      local_89 = tcu::intThresholdCompare
                           (log,"Result","Image comparison result",&local_b8,&local_e0,
                            (UVec4 *)local_80,COMPARE_LOG_ON_ERROR - (levelH == 0));
      if ((bool)local_89) {
        threshold.m_data[2] = 0;
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
        threshold.m_data[2] = 2;
      }
    }
    tcu::Surface::~Surface((Surface *)local_60);
    tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
    if ((threshold.m_data[2] != 0) && (threshold.m_data[2] == 2)) break;
    levelH = levelH + 1;
  }
  return;
}

Assistant:

void TextureSpecCase::verifyTex2D (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_2D);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		if (levelW <= 2 || levelH <= 2)
			continue; // Don't bother checking.

		// Render with GLES2
		setContext(&gles2Context);
		renderTex2D(result, levelW, levelH);

		// Render reference.
		setContext(&refContext);
		renderTex2D(reference, levelW, levelH);

		{
			tcu::UVec4	threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			bool		isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}
	}
}